

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte bVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  int iVar5;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlXPathObjectPtr obj_01;
  ulong uVar6;
  ulong uVar7;
  xmlBufPtr buf;
  xmlChar *pxVar8;
  xmlXPathObjectPtr value;
  unsigned_long local_88;
  unsigned_long p;
  unsigned_long f2;
  unsigned_long f1;
  xmlChar *content;
  xmlChar *cptr;
  xmlChar *point;
  int ch;
  int max;
  int offset;
  xmlBufPtr target;
  xmlXPathObjectPtr to;
  xmlXPathObjectPtr from;
  xmlXPathObjectPtr str;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 3) {
    xmlXPathErr(ctxt,0xc);
    return;
  }
  if (ctxt->valueNr < 3) {
    xmlXPathErr(ctxt,0x17);
    return;
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj = xmlXPathValuePop(ctxt);
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj_00 = xmlXPathValuePop(ctxt);
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj_01 = xmlXPathValuePop(ctxt);
  if (ctxt->error == 0) {
    if (ctxt->context->opLimit != 0) {
      iVar4 = xmlStrlen(obj_00->stringval);
      iVar5 = xmlStrlen(obj_01->stringval);
      if (((long)iVar4 != 0) && ((long)iVar5 != 0)) {
        uVar6 = (ulong)(long)iVar4 / 10 + 1;
        uVar7 = (ulong)(long)iVar5 / 10 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar7;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < uVar6) {
          local_88 = 0xffffffffffffffff;
        }
        else {
          local_88 = uVar6 * uVar7;
        }
        iVar4 = xmlXPathCheckOpLimit(ctxt,local_88);
        if (iVar4 < 0) goto LAB_0022857a;
      }
    }
    buf = xmlBufCreate(0x32);
    if (buf == (xmlBufPtr)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    else {
      iVar4 = xmlUTF8Strlen(obj->stringval);
      content = obj_01->stringval;
      do {
        do {
          bVar3 = *content;
          if (bVar3 == 0) goto LAB_0022852b;
          iVar5 = xmlUTF8Strloc(obj_00->stringval,content);
          if (iVar5 < 0) {
            iVar5 = xmlUTF8Strsize(content,1);
            xmlBufAdd(buf,content,(long)iVar5);
          }
          else if ((iVar5 < iVar4) &&
                  (pxVar8 = xmlUTF8Strpos(obj->stringval,iVar5), pxVar8 != (xmlChar *)0x0)) {
            iVar5 = xmlUTF8Strsize(pxVar8,1);
            xmlBufAdd(buf,pxVar8,(long)iVar5);
          }
          content = content + 1;
        } while ((bVar3 & 0x80) == 0);
        if ((bVar3 & 0xc0) != 0xc0) {
          xmlXPathErr(ctxt,0x15);
          break;
        }
        do {
          bVar3 = bVar3 << 1;
          if ((bVar3 & 0x80) == 0) goto LAB_00228515;
          pxVar8 = content + 1;
          bVar1 = *content;
          content = pxVar8;
        } while ((bVar1 & 0xc0) == 0x80);
        xmlXPathErr(ctxt,0x15);
LAB_00228515:
      } while ((bVar3 & 0x80) == 0);
LAB_0022852b:
      pxVar8 = xmlBufDetach(buf);
      if (pxVar8 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      else {
        value = xmlXPathCacheWrapString(ctxt,pxVar8);
        xmlXPathValuePush(ctxt,value);
      }
      xmlBufFree(buf);
    }
  }
LAB_0022857a:
  xmlXPathReleaseObject(ctxt->context,obj_01);
  xmlXPathReleaseObject(ctxt->context,obj_00);
  xmlXPathReleaseObject(ctxt->context,obj);
  return;
}

Assistant:

void
xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr from = NULL;
    xmlXPathObjectPtr to = NULL;
    xmlBufPtr target;
    int offset, max;
    int ch;
    const xmlChar *point;
    xmlChar *cptr, *content;

    CHECK_ARITY(3);

    CAST_TO_STRING;
    to = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    from = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    /*
     * Account for quadratic runtime
     */
    if (ctxt->context->opLimit != 0) {
        unsigned long f1 = xmlStrlen(from->stringval);
        unsigned long f2 = xmlStrlen(str->stringval);

        if ((f1 > 0) && (f2 > 0)) {
            unsigned long p;

            f1 = f1 / 10 + 1;
            f2 = f2 / 10 + 1;
            p = f1 > ULONG_MAX / f2 ? ULONG_MAX : f1 * f2;
            if (xmlXPathCheckOpLimit(ctxt, p) < 0)
                goto error;
        }
    }

    target = xmlBufCreate(50);
    if (target == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }

    max = xmlUTF8Strlen(to->stringval);
    for (cptr = str->stringval; (ch=*cptr); ) {
        offset = xmlUTF8Strloc(from->stringval, cptr);
        if (offset >= 0) {
            if (offset < max) {
                point = xmlUTF8Strpos(to->stringval, offset);
                if (point)
                    xmlBufAdd(target, point, xmlUTF8Strsize(point, 1));
            }
        } else
            xmlBufAdd(target, cptr, xmlUTF8Strsize(cptr, 1));

        /* Step to next character in input */
        cptr++;
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 ) {
                xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                break;
            }
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*cptr++ & 0xc0) != 0x80 ) {
                    xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                    break;
                }
            if (ch & 0x80) /* must have had error encountered */
                break;
        }
    }

    content = xmlBufDetach(target);
    if (content == NULL)
        xmlXPathPErrMemory(ctxt);
    else
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, content));
    xmlBufFree(target);
error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, from);
    xmlXPathReleaseObject(ctxt->context, to);
}